

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

void hash_table_display(hash_table_t *h,int32 showdisplay)

{
  hash_entry_t *phVar1;
  uint local_28;
  int local_24;
  int j;
  int i;
  hash_entry_t *e;
  int32 showdisplay_local;
  hash_table_t *h_local;
  
  local_28 = 0;
  printf("Hash with chaining representation of the hash table\n");
  for (local_24 = 0; local_24 < h->size; local_24 = local_24 + 1) {
    phVar1 = h->table + local_24;
    if (phVar1->key != (char *)0x0) {
      printf("|key:");
      if (showdisplay == 0) {
        printf("%p",phVar1->key);
      }
      else {
        printf("%s",phVar1->key);
      }
      printf("|len:%zd|val=%ld|->",phVar1->len,phVar1->val);
      if (phVar1->next == (hash_entry_s *)0x0) {
        printf("NULL\n");
      }
      for (_j = phVar1->next; local_28 = local_28 + 1, _j != (hash_entry_s *)0x0; _j = _j->next) {
        printf("|key:");
        if (showdisplay != 0) {
          printf("%s",_j->key);
        }
        printf("|len:%zd|val=%ld|->",_j->len,_j->val);
        if (_j->next == (hash_entry_s *)0x0) {
          printf("NULL\n");
        }
      }
    }
  }
  printf("The total number of keys =%d\n",(ulong)local_28);
  return;
}

Assistant:

void
hash_table_display(hash_table_t * h, int32 showdisplay)
{
    hash_entry_t *e;
    int i, j;
    j = 0;

    printf("Hash with chaining representation of the hash table\n");

    for (i = 0; i < h->size; i++) {
        e = &(h->table[i]);
        if (e->key != NULL) {
            printf("|key:");
            if (showdisplay)
                printf("%s", e->key);
            else
                printf("%p", e->key);

            printf("|len:%zd|val=%ld|->", e->len, (long)e->val);
            if (e->next == NULL) {
                printf("NULL\n");
            }
            j++;

            for (e = e->next; e; e = e->next) {
                printf("|key:");
                if (showdisplay)
                    printf("%s", e->key);

                printf("|len:%zd|val=%ld|->", e->len, (long)e->val);
                if (e->next == NULL) {
                    printf("NULL\n");
                }
                j++;
            }
        }
    }

    printf("The total number of keys =%d\n", j);
}